

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

Color * __thiscall
Scene::shade(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Vector *p,
            Vector *view,GeometricObject *obj)

{
  long *plVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  pointer psVar8;
  Medium *pMVar9;
  Medium *pMVar10;
  long lVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Color *color;
  Vector l;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  double local_188;
  double dStack_180;
  double local_138;
  undefined1 local_118 [96];
  double dStack_b8;
  double local_b0;
  double local_90;
  double local_88;
  double local_80;
  Ray local_78;
  Color local_48;
  
  GeometricObject::find_texture(obj,p,(SurfaceData *)local_118);
  dVar15 = view->z * local_b0 + view->x * (double)local_118._88_8_ + dStack_b8 * view->y;
  dVar16 = dVar15;
  if (0.0 < dVar15) {
    auVar3._8_4_ = local_118._96_4_;
    auVar3._0_8_ = -(double)local_118._88_8_;
    auVar3._12_4_ = local_118._100_4_ ^ 0x80000000;
    stack0xffffffffffffff40 = auVar3;
    local_b0 = -local_b0;
    dVar16 = -dVar15;
  }
  local_78.org.x = p->x;
  local_78.org.y = p->y;
  local_78.org.z = p->z;
  local_1a8._0_8_ = (this->ambient).z * (double)local_118._56_8_ * (double)local_118._0_8_;
  local_1a8._8_8_ = 0;
  dVar20 = (double)local_118._0_8_ * (double)local_118._48_8_ * (this->ambient).y;
  local_1b8._8_4_ = SUB84(dVar20,0);
  local_1b8._0_8_ = (double)local_118._0_8_ * (double)local_118._40_8_ * (this->ambient).x;
  local_1b8._12_4_ = (int)((ulong)dVar20 >> 0x20);
  psVar8 = (this->light).
           super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->light).
      super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      plVar1 = *(long **)((long)&(psVar8->
                                 super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         + lVar11);
      local_138 = (double)(**(code **)(*plVar1 + 0x10))(plVar1,this,p,&local_90);
      if (threshold < local_138) {
        dVar20 = local_80 * local_b0 + local_90 * (double)local_118._88_8_ + local_88 * dStack_b8;
        if (dVar20 <= threshold) {
          if ((dVar20 < -threshold) && (threshold < (double)local_118._32_8_)) {
            dVar20 = dVar20 * -(double)local_118._8_8_ * (double)local_118._32_8_ * local_138;
            if (threshold < dVar20) {
              lVar2 = *(long *)((long)&(((this->light).
                                         super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + lVar11);
              local_1b8._8_8_ =
                   (double)local_1b8._8_8_ +
                   dVar20 * (double)local_118._48_8_ * *(double *)(lVar2 + 0x10);
              local_1b8._0_8_ =
                   (double)local_1b8._0_8_ +
                   dVar20 * (double)local_118._40_8_ * *(double *)(lVar2 + 8);
              local_1a8._0_8_ =
                   (double)local_1a8._0_8_ +
                   *(double *)(lVar2 + 0x18) * (double)local_118._56_8_ * dVar20;
            }
            local_138 = local_138 * (double)local_118._32_8_ * (double)local_118._16_8_;
            if ((((threshold < local_138) && (threshold < view->x - local_90)) &&
                (threshold < view->y - local_88)) && (threshold < view->z - local_80)) {
              pMVar10 = (Medium *)(local_118 + 0x40);
              if (0.0 < dVar15) {
                pMVar10 = &Grayzer::Medium::air;
              }
              dVar19 = pMVar10->ior / curMed->ior;
              dVar20 = -view->x - local_90 * dVar19;
              dVar17 = -view->y - local_88 * dVar19;
              dVar18 = -view->z - local_80 * dVar19;
              dVar19 = SQRT(dVar18 * dVar18 + dVar20 * dVar20 + dVar17 * dVar17);
              dVar20 = dVar20 / dVar19;
              dVar17 = dVar17 / dVar19;
              dVar18 = dVar18 / dVar19;
              lVar2 = *(long *)((long)&(((this->light).
                                         super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + lVar11);
              local_188 = local_138 * *(double *)(lVar2 + 8);
              dStack_180 = local_138 * *(double *)(lVar2 + 0x10);
              local_138 = local_138 * *(double *)(lVar2 + 0x18);
              goto LAB_001037ce;
            }
          }
        }
        else {
          if (threshold < (double)local_118._8_8_) {
            lVar2 = *(long *)((long)&(((this->light).
                                       super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + lVar11);
            dVar20 = dVar20 * (double)local_118._8_8_ * local_138;
            local_1b8._8_8_ =
                 (double)local_1b8._8_8_ +
                 dVar20 * (double)local_118._48_8_ * *(double *)(lVar2 + 0x10);
            local_1b8._0_8_ =
                 (double)local_1b8._0_8_ +
                 dVar20 * (double)local_118._40_8_ * *(double *)(lVar2 + 8);
            local_1a8._0_8_ =
                 (double)local_1a8._0_8_ +
                 dVar20 * *(double *)(lVar2 + 0x18) * (double)local_118._56_8_;
          }
          if (threshold < (double)local_118._16_8_) {
            dVar20 = local_90 - view->x;
            dVar17 = local_88 - view->y;
            dVar18 = local_80 - view->z;
            dVar19 = SQRT(dVar18 * dVar18 + dVar20 * dVar20 + dVar17 * dVar17);
            dVar20 = dVar20 / dVar19;
            dVar17 = dVar17 / dVar19;
            dVar18 = dVar18 / dVar19;
            lVar2 = *(long *)((long)&(((this->light).
                                       super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<LightSource,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + lVar11);
            local_188 = local_138 * (double)local_118._16_8_ * *(double *)(lVar2 + 8);
            dStack_180 = local_138 * (double)local_118._16_8_ * *(double *)(lVar2 + 0x10);
            local_138 = local_138 * (double)local_118._16_8_ * *(double *)(lVar2 + 0x18);
LAB_001037ce:
            dVar20 = pow(local_b0 * dVar18 + (double)local_118._88_8_ * dVar20 + dStack_b8 * dVar17,
                         (double)(int)local_118._80_4_);
            dVar19 = (double)local_1b8._8_8_ + dVar20 * dStack_180;
            local_1b8._8_4_ = SUB84(dVar19,0);
            local_1b8._0_8_ = (double)local_1b8._0_8_ + dVar20 * local_188;
            local_1b8._12_4_ = (int)((ulong)dVar19 >> 0x20);
            uVar13 = local_1a8._12_4_;
            local_1a8._8_4_ = local_1a8._8_4_;
            local_1a8._0_8_ = local_1a8._0_8_ + local_138 * dVar20;
            local_1a8._12_4_ = uVar13;
          }
        }
      }
      uVar12 = uVar12 + 1;
      psVar8 = (this->light).
               super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < (ulong)((long)(this->light).
                                    super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  __return_storage_ptr__->x = (double)local_1b8._0_8_;
  __return_storage_ptr__->y = (double)local_1b8._8_8_;
  __return_storage_ptr__->z = (double)local_1a8._0_8_;
  dVar20 = weight * (double)local_118._32_8_;
  uVar13 = SUB84(threshold,0);
  uVar14 = (undefined4)((ulong)threshold >> 0x20);
  if ((threshold < (double)local_118._24_8_ * weight) && (level < maxLevel)) {
    dVar19 = dVar16 + dVar16;
    local_78.dir.z = view->z - local_b0 * dVar19;
    local_78.dir.x = view->x - dVar19 * (double)local_118._88_8_;
    local_78.dir.y = view->y - dVar19 * dStack_b8;
    trace(&local_48,this,curMed,(double)local_118._24_8_ * weight,&local_78);
    dVar19 = (double)local_1b8._0_8_ + (double)local_118._24_8_ * local_48.x;
    dVar17 = (double)local_1b8._8_8_ + (double)local_118._24_8_ * local_48.y;
    uVar13 = SUB84(dVar17,0);
    uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
    local_1b8._8_4_ = uVar13;
    local_1b8._0_8_ = dVar19;
    local_1b8._12_4_ = uVar14;
    auVar4._8_4_ = uVar13;
    auVar4._0_8_ = dVar19;
    auVar4._12_4_ = uVar14;
    __return_storage_ptr__->x = dVar19;
    __return_storage_ptr__->y = (double)auVar4._8_8_;
    local_1a8._0_8_ = (double)local_1a8._0_8_ + local_48.z * (double)local_118._24_8_;
    __return_storage_ptr__->z = (double)local_1a8._0_8_;
    uVar13 = SUB84(threshold,0);
    uVar14 = (undefined4)((ulong)threshold >> 0x20);
  }
  if (((double)CONCAT44(uVar14,uVar13) <= dVar20 && dVar20 != (double)CONCAT44(uVar14,uVar13)) &&
     (level < maxLevel)) {
    pMVar10 = (Medium *)(local_118 + 0x40);
    pMVar9 = pMVar10;
    if (0.0 < dVar15) {
      pMVar9 = &Grayzer::Medium::air;
    }
    dVar17 = curMed->ior / pMVar9->ior;
    dVar19 = (dVar16 * dVar16 + -1.0) * dVar17 * dVar17 + 1.0;
    if ((double)CONCAT44(uVar14,uVar13) <= dVar19 && dVar19 != (double)CONCAT44(uVar14,uVar13)) {
      dVar18 = view->z;
      dVar6 = view->x;
      dVar7 = view->y;
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
      dVar19 = dVar17 * -dVar16 - dVar19;
      local_78.dir.x = dVar17 * dVar6 + dVar19 * (double)local_118._88_8_;
      local_78.dir.y = dVar17 * dVar7 + dVar19 * dStack_b8;
      local_78.dir.z = dVar18 * dVar17 + dVar19 * local_b0;
      if (0.0 < dVar15) {
        pMVar10 = &Grayzer::Medium::air;
      }
      trace(&local_48,this,pMVar10,dVar20,&local_78);
      dVar16 = (double)local_118._32_8_ * local_48.x + (double)local_1b8._0_8_;
      dVar15 = (double)local_118._32_8_ * local_48.y + (double)local_1b8._8_8_;
      auVar5._8_4_ = SUB84(dVar15,0);
      auVar5._0_8_ = dVar16;
      auVar5._12_4_ = (int)((ulong)dVar15 >> 0x20);
      __return_storage_ptr__->x = dVar16;
      __return_storage_ptr__->y = (double)auVar5._8_8_;
      __return_storage_ptr__->z = local_48.z * (double)local_118._32_8_ + (double)local_1a8._0_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Color Scene::shade(Medium& curMed, double weight, Vector p, Vector view, GeometricObject *obj)
{
   SurfaceData txt;
   Ray   ray;
   Color color;
   Vector l;   // light vector
   double sh;  // light shadow coeff.
   Vector h;   // vector between -View and light
   double ln, vn;
   double t;
   bool entering = true; // flag whether we're entering object
   int   i;

   obj->find_texture(p, txt);
   if((vn = view & txt.n) > 0) // force (-View,n) > 0
   {
      txt.n = -txt.n;
      vn = -vn;
      entering = false;
   }

   ray.org = p;
   color = ambient * txt.color * txt.ka; // get ambient light

   for(i = 0; i < light.size(); i++)
   {
      if((sh = light[i]->shadow(this, p,l)) > threshold)
      {
         if((ln = (l & txt.n)) > threshold) //  light is visible
         {
            // Diffuse
            if(txt.kd > threshold)
               color += light[i]->color * txt.color * (txt.kd * sh * ln);

            // Specular & Phong-like
            if(txt.ks > threshold)
            {
               h = normalize(l - view);
               color += light[i]->color * txt.ks * sh * pow(txt.n & h, txt.p);
            }
         }
         else
         if(txt.kt > threshold && ln < -threshold)
         {
            t = -txt.kd * txt.kt * sh * ln;

            if(t > threshold)
               color += light[i]->color * txt.color * t;

            t = txt.ks * txt.kt * sh;

            if(t > threshold)
            {
               if((view - l) > threshold)
               {
                  double eta = (entering ? txt.med.ior : Grayzer::Medium::air.ior) / curMed.ior;
                  h = normalize( -view - l * eta );
                  color += light[i]->color * t * pow(txt.n & h, txt.p);
               }
            }
         }
      }
   }

   double rWeight = weight * txt.kr; // reflected
   double tWeight = weight * txt.kt; // transmitted

   // check for reflected ray
   if(rWeight > threshold && level < maxLevel)
   {
      ray.dir = view - txt.n * (2 * vn); // get reflected ray
      color += txt.kr * trace(curMed, rWeight, ray);
   }

   // check for transmitted ray
   if(tWeight > threshold && level < maxLevel)
   {
      double eta = curMed.ior / (entering ? txt.med.ior : Grayzer::Medium::air.ior);
      double ci = -vn; //  cosine of incident angle
      double ctSq = 1 + eta * eta * (ci *  ci - 1);

      if(ctSq > threshold) // not a Total Internal Reflection
      {
         ray.dir = view * eta + txt.n * (eta * ci - sqrt(ctSq));
         if(entering) // ray enters object
            color += txt.kt * trace(txt.med, tWeight, ray);
         else          // ray leaves object
            color += txt.kt * trace(Grayzer::Medium::air, tWeight, ray);
      }
   }
   return color;
}